

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O0

void __thiscall
check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d::test_method
          (check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d *this)

{
  allocator<double> *this_00;
  allocator<int> *this_01;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  undefined8 uVar4;
  type_conflict1 tVar5;
  bool bVar6;
  int iVar7;
  reference pvVar8;
  size_type sVar9;
  reference puVar10;
  reference puVar11;
  size_type sVar12;
  reference pvVar13;
  lazy_ostream *prev;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a8;
  assertion_result local_188;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  size_type local_150;
  size_t i_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_140;
  iterator bd2;
  undefined1 local_130 [4];
  int j;
  Boundary_range second_bdrange;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_110;
  iterator bd;
  Boundary_range bdrange;
  undefined1 local_e8 [4];
  int i;
  undefined1 local_e0 [8];
  All_cells_iterator it;
  Bitmap_cubical_complex_base ba;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> elems_in_boundary;
  int number_of_all_elements;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> data;
  allocator<unsigned_int> local_29;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d *this_local;
  
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_int>::allocator(&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,4,&local_29);
  std::allocator<unsigned_int>::~allocator(&local_29);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,0);
  *pvVar8 = 3;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,1);
  *pvVar8 = 3;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,2);
  *pvVar8 = 3;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,3);
  *pvVar8 = 3;
  _number_of_all_elements = 0.0;
  this_00 = (allocator<double> *)
            ((long)&elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this_00);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,0x51,
             (value_type_conflict2 *)&number_of_all_elements,this_00);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,0);
  vVar1 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,1);
  vVar2 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,2);
  vVar3 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,3);
  elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = (vVar1 * 2 + 1) * (vVar2 * 2 + 1) * (vVar3 * 2 + 1) * (*pvVar8 * 2 + 1);
  sVar9 = (size_type)
          (int)elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  this_01 = (allocator<int> *)
            ((long)&ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_01);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,sVar9,
             (value_type_conflict4 *)
             ((long)&ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),this_01);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Bitmap_cubical_complex_base
            ((Bitmap_cubical_complex_base<double> *)&it,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
             (vector<double,_std::allocator<double>_> *)local_58,true);
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::all_cells_iterator_begin
            ((Bitmap_cubical_complex_base<double> *)local_e0);
  while( true ) {
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::all_cells_iterator_end
              ((Bitmap_cubical_complex_base<double> *)local_e8);
    tVar5 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long>
                        *)local_e0,
                       (iterator_facade<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long>
                        *)local_e8);
    if (!tVar5) break;
    bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    puVar10 = boost::iterators::detail::
              iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
              ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                           *)local_e0);
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::boundary_range
              ((Boundary_range *)&bd,(Bitmap_cubical_complex_base<double> *)&it,*puVar10);
    local_110._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
    while( true ) {
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
      bVar6 = __gnu_cxx::operator!=
                        (&local_110,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&second_bdrange.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar6) break;
      puVar11 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_110);
      Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::boundary_range
                ((Boundary_range *)local_130,(Bitmap_cubical_complex_base<double> *)&it,*puVar11);
      bd2._M_current._4_4_ = 1;
      local_140._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
      while( true ) {
        i_1 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130)
        ;
        bVar6 = __gnu_cxx::operator!=
                          (&local_140,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&i_1);
        if (!bVar6) break;
        iVar7 = bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ * bd2._M_current._4_4_;
        puVar11 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_140);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_80,*puVar11);
        *pvVar13 = iVar7 + *pvVar13;
        bd2._M_current._4_4_ = -bd2._M_current._4_4_;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_140);
      }
      bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           -bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_110);
    }
    for (local_150 = 0; sVar9 = local_150,
        sVar12 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)local_80), sVar9 != sVar12;
        local_150 = local_150 + 1) {
      do {
        uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_160,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_170);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_160,0x445,&local_170);
        pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_80,local_150);
        boost::test_tools::assertion_result::assertion_result(&local_188,*pvVar13 == 0);
        prev = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_1b8,"elems_in_boundary[i] == 0",0x19);
        boost::unit_test::operator<<(&local_1a8,prev,&local_1b8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::test_tools::tt_detail::report_assertion(&local_188,&local_1a8,&local_1c8,0x445,1,0,0)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_1a8);
        boost::test_tools::assertion_result::~assertion_result(&local_188);
        bVar6 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar6);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                  *)local_e0);
  }
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::~Bitmap_cubical_complex_base
            ((Bitmap_cubical_complex_base<double> *)&it);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d) {
  std::vector<unsigned> sizes(4);
  sizes[0] = 3;
  sizes[1] = 3;
  sizes[2] = 3;
  sizes[3] = 3;

  std::vector<double> data(81, 0);

  int number_of_all_elements = (2 * sizes[0] + 1) * (2 * sizes[1] + 1) * (2 * sizes[2] + 1) * (2 * sizes[3] + 1);
  std::vector<int> elems_in_boundary(number_of_all_elements, 0);
  Bitmap_cubical_complex_base ba(sizes, data);
  for (auto it = ba.all_cells_iterator_begin();
       it != ba.all_cells_iterator_end(); ++it) {    
    int i = 1;
    Bitmap_cubical_complex_base::Boundary_range bdrange = ba.boundary_range(*it);
    for (auto bd = bdrange.begin(); bd != bdrange.end(); ++bd) {
      Bitmap_cubical_complex_base::Boundary_range second_bdrange = ba.boundary_range(*bd);
      int j = 1;
      for (auto bd2 = second_bdrange.begin(); bd2 != second_bdrange.end();
           ++bd2) {
        elems_in_boundary[*bd2] += i * j;
        j *= -1;
      }
      i *= -1;
    }
    // check if there is anything nonzero in elems_in_boundary
    for (size_t i = 0; i != elems_in_boundary.size(); ++i) {
      BOOST_CHECK(elems_in_boundary[i] == 0);
    }
  }
}